

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFileDB.cpp
# Opt level: O1

void __thiscall ObjectFileDB::find_code(ObjectFileDB *this)

{
  LinkedObjectFile *this_00;
  key_type *pkVar1;
  long lVar2;
  int iVar3;
  iterator iVar4;
  Config *pCVar5;
  int64_t iVar6;
  key_type *__k;
  ObjectFileData *obj;
  long lVar7;
  bool bVar8;
  Stats combined_stats;
  Timer timer;
  string local_100;
  key_type *local_e0;
  ObjectFileDB *local_d8;
  key_type *local_d0;
  Stats local_c8;
  Timer local_68;
  string local_50;
  
  puts("- Finding code in object files...");
  local_c8.data_bytes = 0;
  local_c8.code_bytes = 0;
  local_c8.function_count = 0;
  local_c8.decoded_ops = 0;
  local_c8.v3_link_bytes = 0;
  local_c8.v3_symbol_count = 0;
  local_c8.v3_symbol_link_offset = 0;
  local_c8.v3_symbol_link_word = 0;
  local_c8.v3_pointers = 0;
  local_c8.v3_split_pointers = 0;
  local_c8.v3_word_pointers = 0;
  local_c8.v3_pointer_seeks = 0;
  local_c8.total_v2_link_bytes = 0;
  local_c8.total_v2_symbol_links = 0;
  local_c8.total_v2_symbol_count = 0;
  local_c8.v3_code_bytes = 0;
  local_c8.total_code_bytes = 0;
  local_c8.total_v2_code_bytes = 0;
  local_c8.total_v2_pointers = 0;
  local_c8.total_v2_pointer_seeks = 0;
  local_c8.n_fp_reg_use = 0;
  local_c8.n_fp_reg_use_resolved = 0;
  local_68._startTime.tv_sec = 0;
  local_68._startTime.tv_nsec = 0;
  Timer::start(&local_68);
  pkVar1 = (this->obj_file_order).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  __k = (this->obj_file_order).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_d8 = this;
  if ((this->obj_files_by_name)._M_h._M_element_count != (long)pkVar1 - (long)__k >> 5) {
LAB_00121ce9:
    __assert_fail("obj_files_by_name.size() == obj_file_order.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.h"
                  ,0x3e,
                  "void ObjectFileDB::for_each_obj(Func) [Func = (lambda at /workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/ObjectFileDB.cpp:331:16)]"
                 );
  }
  if (__k != pkVar1) {
    local_e0 = pkVar1;
    do {
      local_d0 = __k;
      iVar4 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)local_d8,__k);
      if (iVar4.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
        goto LAB_00121ce9;
      }
      lVar2 = *(long *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                              ._M_cur + 0x30);
      for (lVar7 = *(long *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<ObjectFileData,_std::allocator<ObjectFileData>_>_>,_true>
                                   ._M_cur + 0x28); lVar7 != lVar2; lVar7 = lVar7 + 0x120) {
        this_00 = (LinkedObjectFile *)(lVar7 + 0x18);
        LinkedObjectFile::find_code(this_00);
        LinkedObjectFile::find_functions(this_00);
        LinkedObjectFile::disassemble_functions(this_00);
        pCVar5 = get_config();
        bVar8 = true;
        if (pCVar5->game_version != 1) {
          ObjectFileRecord::to_unique_name_abi_cxx11_(&local_50,(ObjectFileRecord *)(lVar7 + 0xf0));
          iVar3 = std::__cxx11::string::compare((char *)&local_50);
          bVar8 = iVar3 != 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
        if (bVar8) {
          LinkedObjectFile::process_fp_relative_links(this_00);
        }
        else {
          ObjectFileRecord::to_unique_name_abi_cxx11_(&local_100,(ObjectFileRecord *)(lVar7 + 0xf0))
          ;
          printf("skipping process_fp_relative_links in %s\n",local_100._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        if (*(uint *)(lVar7 + 100) < *(uint *)(lVar7 + 0x5c) >> 2) {
          ObjectFileRecord::to_unique_name_abi_cxx11_(&local_100,(ObjectFileRecord *)(lVar7 + 0xf0))
          ;
          printf("Failed to decode all in %s (%d / %d)\n",local_100._M_dataplus._M_p,
                 (ulong)*(uint *)(lVar7 + 100),(ulong)(*(uint *)(lVar7 + 0x5c) >> 2));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_dataplus._M_p != &local_100.field_2) {
            operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
          }
        }
        LinkedObjectFile::Stats::add(&local_c8,(Stats *)this_00);
      }
      __k = local_d0 + 1;
    } while (__k != local_e0);
  }
  puts("Found code:");
  printf(" code %.3f MB\n",SUB84((double)((float)((ulong)local_c8._64_8_ >> 0x20) * 9.536743e-07),0)
        );
  printf(" data %.3f MB\n",SUB84((double)((float)(local_c8._64_8_ & 0xffffffff) * 9.536743e-07),0));
  printf(" functions: %d\n",local_c8._72_8_ & 0xffffffff);
  printf(" fp uses resolved: %d / %d (%.3f %%)\n",
         SUB84((double)(((float)((ulong)local_c8._80_8_ >> 0x20) * 100.0) /
                       (float)(local_c8._80_8_ & 0xffffffff)),0));
  printf(" decoded %d / %d (%.3f %%)\n",
         SUB84((double)(((float)((ulong)local_c8._72_8_ >> 0x20) * 100.0) /
                       (float)(local_c8.code_bytes >> 2)),0));
  iVar6 = Timer::getNs(&local_68);
  printf(" total %.3f ms\n",SUB84((double)iVar6 / 1000000.0,0));
  putchar(10);
  return;
}

Assistant:

void ObjectFileDB::find_code() {
  printf("- Finding code in object files...\n");
  LinkedObjectFile::Stats combined_stats;
  Timer timer;

  for_each_obj([&](ObjectFileData& obj) {
    //      printf("fc %s\n", obj.record.to_unique_name().c_str());
    obj.linked_data.find_code();
    obj.linked_data.find_functions();
    obj.linked_data.disassemble_functions();

    if (get_config().game_version == 1 || obj.record.to_unique_name() != "effect-control-v0") {
      obj.linked_data.process_fp_relative_links();
    } else {
      printf("skipping process_fp_relative_links in %s\n", obj.record.to_unique_name().c_str());
    }

    auto& obj_stats = obj.linked_data.stats;
    if (obj_stats.code_bytes / 4 > obj_stats.decoded_ops) {
      printf("Failed to decode all in %s (%d / %d)\n", obj.record.to_unique_name().c_str(),
             obj_stats.decoded_ops, obj_stats.code_bytes / 4);
    }
    combined_stats.add(obj.linked_data.stats);
  });

  printf("Found code:\n");
  printf(" code %.3f MB\n", combined_stats.code_bytes / (float)(1 << 20));
  printf(" data %.3f MB\n", combined_stats.data_bytes / (float)(1 << 20));
  printf(" functions: %d\n", combined_stats.function_count);
  printf(" fp uses resolved: %d / %d (%.3f %%)\n", combined_stats.n_fp_reg_use_resolved,
         combined_stats.n_fp_reg_use,
         100.f * (float)combined_stats.n_fp_reg_use_resolved / combined_stats.n_fp_reg_use);
  auto total_ops = combined_stats.code_bytes / 4;
  printf(" decoded %d / %d (%.3f %%)\n", combined_stats.decoded_ops, total_ops,
         100.f * (float)combined_stats.decoded_ops / total_ops);
  printf(" total %.3f ms\n", timer.getMs());
  printf("\n");
}